

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void qt_init_tooltip_palette(void)

{
  QPlatformTheme *pQVar1;
  QHash<QByteArray,_QFont> *palette;
  long in_FS_OFFSET;
  QPalette *toolTipPalette;
  QPalette toolTipPal;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QGuiApplicationPrivate::platformTheme();
  palette = (QHash<QByteArray,_QFont> *)(**(code **)(*(long *)pQVar1 + 0x50))(pQVar1,1);
  if (palette != (QHash<QByteArray,_QFont> *)0x0) {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::QPalette((QPalette *)local_18,(QPalette *)palette);
    QPalette::setResolveMask((ulonglong)local_18);
    QToolTip::setPalette(palette);
    QPalette::~QPalette((QPalette *)local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_init_tooltip_palette()
{
#if QT_CONFIG(tooltip)
    if (const QPalette *toolTipPalette = QGuiApplicationPrivate::platformTheme()->palette(QPlatformTheme::ToolTipPalette)) {
        QPalette toolTipPal = *toolTipPalette;
        toolTipPal.setResolveMask(0);
        QToolTip::setPalette(toolTipPal);
    }
#endif
}